

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 float64_to_floatx80_mipsel(float64 a,float_status *status)

{
  long lVar1;
  int iVar2;
  commonNaNT a_00;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  floatx80 fVar7;
  floatx80 fVar8;
  commonNaNT z;
  undefined7 uStack_17;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar3 = a & 0xfffffffffffff;
  uVar4 = (uint)(a >> 0x20);
  uVar5 = uVar4 >> 0x14 & 0x7ff;
  iVar2 = (int)uVar4 >> 0x1f;
  if (uVar5 == 0) {
    if (uVar3 == 0) {
      return (floatx80)(ZEXT416((uint)(iVar2 * -0x8000)) << 0x40);
    }
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar4 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    uVar3 = uVar3 << ((byte)uVar4 & 0x3f);
    uVar5 = 1 - (uVar4 & 0xff);
  }
  else if (uVar5 == 0x7ff) {
    if (uVar3 != 0) {
      if (status->snan_bit_is_one == '\0') {
        bVar6 = (a & 0x7ffffffffffff) != 0 && (a & 0x7ff8000000000000) == 0x7ff0000000000000;
      }
      else {
        bVar6 = 0xffe < (uVar4 >> 0x13 & 0xfff);
      }
      if (bVar6) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      a_00._1_7_ = uStack_17;
      a_00.sign = (byte)(a >> 0x3f);
      a_00.high = a << 0xc;
      a_00.low = 0;
      fVar8 = commonNaNToFloatx80(a_00,status);
      return fVar8;
    }
    fVar8._8_4_ = iVar2 * -0x8000 | 0x7fff;
    fVar8.low = 0x8000000000000000;
    fVar8._12_4_ = 0;
    return fVar8;
  }
  fVar7.low = uVar3 << 0xb | 0x8000000000000000;
  fVar7._8_4_ = iVar2 * -0x8000 + uVar5 + 0x3c00;
  fVar7._12_4_ = 0;
  return fVar7;
}

Assistant:

floatx80 float64_to_floatx80(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloatx80(float64ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    return
        packFloatx80(
            aSign, aExp + 0x3C00, (aSig | UINT64_C(0x0010000000000000)) << 11);

}